

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O2

Am_Value step_1D(Am_Value *curr_value,Am_Value *step_size,Am_Value *value2,bool *keep_running)

{
  bool bVar1;
  Am_Value_Type AVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  undefined1 *in_R8;
  float fVar4;
  float fVar5;
  float fVar6;
  Am_Value AVar7;
  
  fVar4 = Am_Value::operator_cast_to_float(step_size);
  fVar5 = Am_Value::operator_cast_to_float(value2);
  bVar1 = Am_Value::Exists((Am_Value *)keep_running);
  if (bVar1) {
    fVar6 = Am_Value::operator_cast_to_float((Am_Value *)keep_running);
    aVar3 = extraout_RDX_00;
    if (fVar6 <= fVar4) {
      if (fVar4 <= fVar6) goto LAB_001a6230;
      fVar5 = fVar4 - fVar5;
      bVar1 = fVar6 < fVar5;
    }
    else {
      fVar5 = fVar4 + fVar5;
      bVar1 = fVar5 < fVar6;
    }
    fVar4 = fVar6;
    if (!bVar1 && fVar5 != fVar6) goto LAB_001a6230;
  }
  else {
    aVar3 = extraout_RDX;
    fVar5 = fVar4 + fVar5;
  }
  fVar4 = fVar5;
  *in_R8 = 1;
LAB_001a6230:
  if ((step_size->type & 0xfffe) == 2) {
    curr_value->value = (anon_union_8_8_ea4c8939_for_value)(long)(int)fVar4;
    AVar2 = 2;
  }
  else {
    (curr_value->value).float_value = fVar4;
    AVar2 = 5;
  }
  curr_value->type = AVar2;
  AVar7.value.wrapper_value = aVar3.wrapper_value;
  AVar7._0_8_ = curr_value;
  return AVar7;
}

Assistant:

static Am_Value
step_1D(const Am_Value &curr_value, const Am_Value &step_size,
        const Am_Value &value2, bool &keep_running)
{
  float v = curr_value;
  float step = step_size;

  if (value2.Exists()) {
    float v2 = value2;

    if (v < v2) {
      v += step;
      if (v > v2)
        v = v2;
      else
        keep_running = true;
    } else if (v > v2) {
      v -= step;
      if (v < v2)
        v = v2;
      else
        keep_running = true;
    }
  } else {
    v += step;
    keep_running = true;
  }

  if (curr_value.type == Am_INT || curr_value.type == Am_LONG)
    return (int)v;
  else
    return v;
}